

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenkoFPM::BuildBeam
          (ChBuilderBeamTaperedTimoshenkoFPM *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> *sect,int N,
          ChVector<double> *A,ChVector<double> *B,ChVector<double> *Ydir)

{
  undefined8 *puVar1;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ChMesh *pCVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  ChNodeFEAxyzrot *pCVar11;
  ChElementBeamTaperedTimoshenkoFPM *this_01;
  pointer psVar12;
  ChVector<double> *pCVar13;
  value_type *__x;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  ChVector<double> v;
  shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM> element;
  ChMatrix33<double> mrot;
  value_type local_258;
  value_type local_248;
  undefined8 local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_230;
  undefined8 local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  shared_ptr<chrono::fea::ChElementBase> local_218;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_208;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_1f8;
  long local_1e8;
  double local_1e0;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> *local_1d8;
  ChBuilderBeamTaperedTimoshenkoFPM *local_1d0;
  _func_int **local_1c8;
  ChVector<double> *local_1c0;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> local_1b8;
  ChVector<double> local_1a8;
  ChFrame<double> local_188;
  ChFrame<double> local_100;
  ChMatrix33<double> local_78;
  
  local_1d8 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_1d0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  dVar31 = B->m_data[0] - A->m_data[0];
  auVar17 = vsubpd_avx(*(undefined1 (*) [16])(B->m_data + 1),*(undefined1 (*) [16])(A->m_data + 1));
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  uVar5 = vcmppd_avx512vl(auVar17,ZEXT816(0) << 0x40,0);
  if ((byte)((byte)(uVar5 & 3) & dVar31 == 0.0 & (byte)((uVar5 & 3) >> 1)) == 0) {
    dVar23 = auVar17._0_8_;
    auVar17 = vshufpd_avx(auVar17,auVar17,1);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar23 * dVar23;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar31;
    auVar16 = vfmadd231sd_fma(auVar18,auVar19,auVar19);
    auVar16 = vfmadd231sd_fma(auVar16,auVar17,auVar17);
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    bVar9 = 2.2250738585072014e-308 <= auVar16._0_8_;
    dVar27 = 1.0 / auVar16._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (ulong)bVar9 * (long)(auVar17._0_8_ * dVar27);
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)((ulong)bVar9 * (long)(dVar23 * dVar27));
    auVar17._0_8_ = (ulong)bVar9 * (long)(dVar31 * dVar27) + (ulong)!bVar9 * 0x3ff0000000000000;
    auVar17._8_8_ = 0;
  }
  else {
    auVar17 = ZEXT816(0x3ff0000000000000);
    auVar16 = ZEXT816(0) << 0x40;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = Ydir->m_data[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = Ydir->m_data[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = Ydir->m_data[1];
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar17._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar16._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       Ydir->m_data[2] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar18 = vfmsub231sd_fma(auVar28,auVar16,auVar37);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       Ydir->m_data[1] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar19 = vfmsub231sd_fma(auVar24,auVar10,auVar32);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar19._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       Ydir->m_data[0] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar20 = vfmsub231sd_fma(auVar20,auVar17,auVar35);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar20._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar18._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmadd231sd_fma(auVar39,auVar19,auVar19);
  auVar18 = vfmadd231sd_fma(auVar18,auVar20,auVar20);
  auVar18 = vsqrtsd_avx(auVar18,auVar18);
  dVar31 = auVar18._0_8_;
  if (0.0001 <= dVar31) goto LAB_005e61c5;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar18 = vandpd_avx512vl(auVar37,auVar6);
  if (0.9 <= auVar18._0_8_) {
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(auVar35,auVar7);
    if (0.9 <= auVar18._0_8_) {
      auVar8._8_8_ = 0x7fffffffffffffff;
      auVar8._0_8_ = 0x7fffffffffffffff;
      auVar18 = vandpd_avx512vl(auVar32,auVar8);
      auVar19 = ZEXT816(0);
      if (0.9 <= auVar18._0_8_) goto LAB_005e618f;
      auVar18 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar19 = ZEXT816(0x3ff0000000000000);
LAB_005e618f:
      auVar18 = ZEXT816(0);
    }
    auVar20 = ZEXT816(0);
  }
  else {
    auVar20 = ZEXT816(0x3ff0000000000000);
    auVar18 = ZEXT816(0);
    auVar19 = ZEXT816(0);
  }
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       auVar18._0_8_ *
       -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar24 = vfmadd231sd_fma(auVar29,auVar16,auVar20);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       auVar19._0_8_ *
       -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar18 = vfmadd231sd_fma(auVar25,auVar10,auVar18);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar18._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       auVar20._0_8_ *
       -local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar19 = vfmadd231sd_fma(auVar21,auVar17,auVar19);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar19._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar24._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmadd231sd_fma(auVar33,auVar18,auVar18);
  auVar18 = vfmadd231sd_fma(auVar18,auVar19,auVar19);
  auVar18 = vsqrtsd_avx(auVar18,auVar18);
  dVar31 = auVar18._0_8_;
LAB_005e61c5:
  dVar31 = 1.0 / dVar31;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar31;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar31;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar31;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar16 = vfmsub231sd_fma(auVar34,auVar30,auVar16);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar17 = vfmsub231sd_fma(auVar36,auVar22,auVar17);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmsub231sd_fma(auVar38,auVar26,auVar10);
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar16._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar17._0_8_;
  local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar18._0_8_;
  pCVar13 = A;
  local_1c0 = B;
  ChFrame<double>::ChFrame(&local_100,A,&local_78);
  pCVar11 = (ChNodeFEAxyzrot *)
            ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar13);
  local_188._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_1c8 = (_func_int **)&PTR__ChFrame_00b03780;
  local_188.coord.pos.m_data[0] = local_100.coord.pos.m_data[0];
  local_188.coord.pos.m_data[1] = local_100.coord.pos.m_data[1];
  local_188.coord.pos.m_data[2] = local_100.coord.pos.m_data[2];
  local_188.coord.rot.m_data[0] = local_100.coord.rot.m_data[0];
  local_188.coord.rot.m_data[1] = local_100.coord.rot.m_data[1];
  local_188.coord.rot.m_data[2] = local_100.coord.rot.m_data[2];
  local_188.coord.rot.m_data[3] = local_100.coord.rot.m_data[3];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar11,&local_188);
  local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar11;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
            (&local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pCVar11);
  pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ChNodeFEAbase;
  local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(pCVar2,&local_1f8);
  if (local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,&local_248);
  if (0 < N) {
    local_1e0 = (double)N;
    local_1e8 = (ulong)(uint)N << 4;
    iVar15 = 1;
    lVar14 = 0;
    do {
      auVar17 = *(undefined1 (*) [16])A->m_data;
      dVar31 = (double)iVar15 / local_1e0;
      auVar16 = vsubpd_avx(*(undefined1 (*) [16])local_1c0->m_data,auVar17);
      local_1a8.m_data[2] = A->m_data[2] + dVar31 * (local_1c0->m_data[2] - A->m_data[2]);
      local_1a8.m_data[0] = auVar17._0_8_ + dVar31 * auVar16._0_8_;
      local_1a8.m_data[1] = auVar17._8_8_ + dVar31 * auVar16._8_8_;
      pCVar13 = &local_1a8;
      ChFrame<double>::ChFrame(&local_100,pCVar13,&local_78);
      pCVar11 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar13);
      local_188._vptr_ChFrame = local_1c8;
      local_188.coord.pos.m_data[0] = local_100.coord.pos.m_data[0];
      local_188.coord.pos.m_data[1] = local_100.coord.pos.m_data[1];
      local_188.coord.pos.m_data[2] = local_100.coord.pos.m_data[2];
      local_188.coord.rot.m_data[0] = local_100.coord.rot.m_data[0];
      local_188.coord.rot.m_data[1] = local_100.coord.rot.m_data[1];
      local_188.coord.rot.m_data[2] = local_100.coord.rot.m_data[2];
      local_188.coord.rot.m_data[3] = local_100.coord.rot.m_data[3];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar11,&local_188);
      local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = pCVar11;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_258.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pCVar11);
      pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_258.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_258.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar2,&local_208);
      if (local_208.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __x = &local_258;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,__x);
      this_01 = (ChElementBeamTaperedTimoshenkoFPM *)
                ChElementBeamTaperedTimoshenkoFPM::operator_new
                          ((ChElementBeamTaperedTimoshenkoFPM *)0x250,(size_t)__x);
      ChElementBeamTaperedTimoshenkoFPM::ChElementBeamTaperedTimoshenkoFPM(this_01);
      local_188._vptr_ChFrame = (_func_int **)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamTaperedTimoshenkoFPM*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188.coord,this_01);
      pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_218.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_188._vptr_ChFrame;
      local_218.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_188.coord.pos.m_data[0] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar2,&local_218);
      if (local_218.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>_>_>
      ::push_back(&local_1d0->beam_elems,(value_type *)&local_188);
      psVar12 = (this_00->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(psVar12->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar14);
      local_228 = *puVar1;
      p_Stack_220 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar3 = *(long *)((long)&(psVar12->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               )._M_refcount._M_pi + lVar14);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
          psVar12 = (this_00->
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      puVar1 = (undefined8 *)
               ((long)&psVar12[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar14);
      local_238 = *puVar1;
      p_Stack_230 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar3 = *(long *)((long)&psVar12[1].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + lVar14);
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      (*(((ChElementBeamTaperedTimoshenko *)local_188._vptr_ChFrame)->super_ChElementBeam).
        super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1a])
                (local_188._vptr_ChFrame,&local_228,&local_238);
      if (p_Stack_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_230);
      }
      if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_220);
      }
      local_1b8.
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (local_1d8->
                super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_1b8.
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (local_1d8->
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      p_Var4 = (local_1d8->
               super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      ChElementBeamTaperedTimoshenkoFPM::SetTaperedSection
                ((ChElementBeamTaperedTimoshenkoFPM *)local_188._vptr_ChFrame,&local_1b8);
      if (local_1b8.
          super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1b8.
                   super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.coord.pos.m_data[0]);
      }
      if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar15 = iVar15 + 1;
      lVar14 = lVar14 + 0x10;
    } while (local_1e8 != lVar14);
  }
  if (local_248.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenkoFPM::BuildBeam(
    std::shared_ptr<ChMesh> mesh,                                         // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> sect,  // section material for beam elements
    const int N,                                                          // number of elements in the segment
    const ChVector<> A,                                                   // starting point
    const ChVector<> B,                                                   // ending point
    const ChVector<> Ydir                                                 // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(A, mrot));
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenkoFPM>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        element->SetTaperedSection(sect);
    }
}